

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Aig_Man_t *
Aig_ManFraigPartitioned(Aig_Man_t *pAig,int nPartSize,int nConfMax,int nLevelMax,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Ptr_t *p;
  Vec_Int_t *vPart_00;
  void *__ptr;
  void *pvVar6;
  Aig_Man_t *p_00;
  Aig_Man_t *pAVar7;
  int local_58;
  int local_54;
  int k;
  int i;
  void **ppData;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vParts;
  Vec_Int_t *vPart;
  Aig_Man_t *pAigTemp;
  Aig_Man_t *pAigPart;
  int fVerbose_local;
  int nLevelMax_local;
  int nConfMax_local;
  int nPartSize_local;
  Aig_Man_t *pAig_local;
  
  p = Aig_ManPartitionNaive(pAig,nPartSize);
  iVar1 = Aig_ManObjNumMax(pAig);
  Aig_ManReprStart(pAig,iVar1);
  Aig_ManSetCioIds(pAig);
  for (local_54 = 0; iVar1 = Vec_PtrSize(p), local_54 < iVar1; local_54 = local_54 + 1) {
    vPart_00 = (Vec_Int_t *)Vec_PtrEntry(p,local_54);
    pAVar7 = Aig_ManDupPartAll(pAig,vPart_00);
    iVar1 = Aig_ManObjNumMax(pAVar7);
    __ptr = malloc((long)iVar1 << 3);
    for (local_58 = 0; iVar1 = Vec_PtrSize(pAVar7->vObjs), local_58 < iVar1; local_58 = local_58 + 1
        ) {
      pvVar6 = Vec_PtrEntry(pAVar7->vObjs,local_58);
      if (pvVar6 != (void *)0x0) {
        *(undefined8 *)((long)__ptr + (long)local_58 * 8) = *(undefined8 *)((long)pvVar6 + 0x28);
      }
    }
    if (fVerbose != 0) {
      uVar2 = Vec_PtrSize(p);
      uVar3 = Aig_ManCiNum(pAVar7);
      uVar4 = Aig_ManCoNum(pAVar7);
      uVar5 = Aig_ManNodeNum(pAVar7);
      iVar1 = Aig_ManLevelNum(pAVar7);
      printf("Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
             (ulong)(local_54 + 1),(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,iVar1);
    }
    p_00 = Fra_FraigChoice(pAVar7,nConfMax,nLevelMax);
    Aig_ManStop(p_00);
    for (local_58 = 0; iVar1 = Vec_PtrSize(pAVar7->vObjs), local_58 < iVar1; local_58 = local_58 + 1
        ) {
      pvVar6 = Vec_PtrEntry(pAVar7->vObjs,local_58);
      if (pvVar6 != (void *)0x0) {
        *(undefined8 *)((long)pvVar6 + 0x28) = *(undefined8 *)((long)__ptr + (long)local_58 * 8);
      }
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    if (pAVar7->pReprs != (Aig_Obj_t **)0x0) {
      Aig_ManTransferRepr(pAig,pAVar7);
    }
    Aig_ManStop(pAVar7);
  }
  if (fVerbose != 0) {
    printf(
          "                                                                                          \r"
          );
  }
  Vec_VecFree((Vec_Vec_t *)p);
  Aig_ManCleanCioIds(pAig);
  pAVar7 = Aig_ManDupRepr(pAig,0);
  return pAVar7;
}

Assistant:

Aig_Man_t * Aig_ManFraigPartitioned( Aig_Man_t * pAig, int nPartSize, int nConfMax, int nLevelMax, int fVerbose )
{
//    extern Aig_Man_t * Fra_FraigChoice( Aig_Man_t * pManAig, int nConfMax, int nLevelMax );

    Aig_Man_t * pAigPart, * pAigTemp;
    Vec_Int_t * vPart;
    Vec_Ptr_t * vParts;
    Aig_Obj_t * pObj;
    void ** ppData;
    int i, k;

    // partition the outputs of the AIG
    vParts = Aig_ManPartitionNaive( pAig, nPartSize );

    // start the equivalence classes
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );

    // set the PI numbers
    Aig_ManSetCioIds( pAig );

    // create the total fraiged AIG
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        // derive the partition AIG
        pAigPart = Aig_ManDupPartAll( pAig, vPart );
        // store contents of pData pointers
        ppData = ABC_ALLOC( void *, Aig_ManObjNumMax(pAigPart) );
        Aig_ManForEachObj( pAigPart, pObj, k )
            ppData[k] = pObj->pData;
        // report the process
        if ( fVerbose )
        printf( "Part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAigPart), Aig_ManCoNum(pAigPart), 
            Aig_ManNodeNum(pAigPart), Aig_ManLevelNum(pAigPart) );
        // compute equivalence classes (to be stored in pNew->pReprs)
        pAigTemp = Fra_FraigChoice( pAigPart, nConfMax, nLevelMax );
        Aig_ManStop( pAigTemp );
        // reset the pData pointers
        Aig_ManForEachObj( pAigPart, pObj, k )
            pObj->pData = ppData[k];
        ABC_FREE( ppData );
        // transfer representatives to the total AIG
        if ( pAigPart->pReprs )
            Aig_ManTransferRepr( pAig, pAigPart );
        Aig_ManStop( pAigPart );
    }
    if ( fVerbose )
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );

    // clear the PI numbers
    Aig_ManCleanCioIds( pAig );

    // derive the result of choicing
    return Aig_ManDupRepr( pAig, 0 );
}